

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

BrotliDecoderErrorCode
DecodeContextMap(uint32_t context_map_size,uint32_t *num_htrees,uint8_t **context_map_arg,
                BrotliDecoderStateInternal *s)

{
  uint32_t *puVar1;
  byte bVar2;
  byte *pbVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  BrotliRunningContextMapState BVar7;
  uint8_t *puVar8;
  HuffmanCode *pHVar9;
  uint32_t uVar10;
  size_t sVar11;
  ulong unaff_RBP;
  uint32_t uVar12;
  uint64_t uVar13;
  BrotliBitReader *br;
  BrotliDecoderErrorCode in_R9D;
  BrotliDecoderErrorCode BVar14;
  ulong unaff_R12;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  uint32_t code;
  uint32_t local_58;
  uint32_t local_54;
  BrotliBitReader *local_50;
  BrotliDecoderErrorCode local_48;
  uint32_t local_44;
  HuffmanCode *local_40;
  uint8_t **local_38;
  
  BVar7 = (s->arena).header.substate_context_map;
  if (BROTLI_STATE_CONTEXT_MAP_TRANSFORM < BVar7) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  br = &s->br;
  switch(BVar7) {
  case BROTLI_STATE_CONTEXT_MAP_NONE:
    BVar14 = DecodeVarLenUint8(s,br,num_htrees);
    if (BVar14 != BROTLI_DECODER_SUCCESS) {
      return BVar14;
    }
    *num_htrees = *num_htrees + 1;
    (s->arena).header.context_index = 0;
    unaff_R12 = (ulong)context_map_size;
    puVar8 = (uint8_t *)(*s->alloc_func)(s->memory_manager_opaque,unaff_R12);
    *context_map_arg = puVar8;
    if (puVar8 == (uint8_t *)0x0) {
      return BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP;
    }
    if (*num_htrees < 2) {
      memset(puVar8,0,unaff_R12);
      return BROTLI_DECODER_SUCCESS;
    }
    (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
    break;
  case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
    goto switchD_00140423_caseD_2;
  case BROTLI_STATE_CONTEXT_MAP_DECODE:
    goto LAB_0014059e;
  case BROTLI_STATE_CONTEXT_MAP_TRANSFORM:
    goto switchD_00140423_caseD_4;
  }
  uVar12 = (s->br).bit_pos_;
  bVar18 = uVar12 - 0x3c < 5;
  if (bVar18) {
    sVar11 = (s->br).avail_in;
    if (sVar11 != 0) {
      uVar16 = (s->br).val_;
      pbVar3 = (s->br).next_in;
      (s->br).val_ = uVar16 >> 8;
      (s->br).val_ = (ulong)*pbVar3 << 0x38 | uVar16 >> 8;
      uVar12 = uVar12 - 8;
      (s->br).bit_pos_ = uVar12;
      (s->br).avail_in = sVar11 - 1;
      (s->br).next_in = pbVar3 + 1;
      bVar18 = false;
      goto LAB_00140509;
    }
    uVar6 = 0;
  }
  else {
LAB_00140509:
    uVar6 = (uint)(br->val_ >> ((byte)uVar12 & 0x3f)) & 0x1f;
  }
  if (bVar18) {
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  (s->arena).header.max_run_length_prefix = (uVar6 >> 1) + 1 & -(uVar6 & 1);
  (s->br).bit_pos_ = (s->br).bit_pos_ + (uVar6 & 1) * 4 + 1;
  (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
switchD_00140423_caseD_2:
  unaff_RBP = (ulong)context_map_size;
  uVar12 = (s->arena).header.max_run_length_prefix + *num_htrees;
  BVar14 = ReadHuffmanCode(uVar12,uVar12,(s->arena).header.context_map_table,(uint32_t *)0x0,s);
  if (BVar14 != BROTLI_DECODER_SUCCESS) {
    return BVar14;
  }
  (s->arena).header.code = 0xffff;
  (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
  in_R9D = BROTLI_DECODER_NEEDS_MORE_INPUT;
LAB_0014059e:
  uVar6 = (s->arena).header.context_index;
  local_44 = (s->arena).header.max_run_length_prefix;
  puVar8 = *context_map_arg;
  local_58 = (s->arena).header.code;
  bVar17 = local_58 != 0xffff;
  bVar18 = uVar6 < context_map_size || bVar17;
  local_38 = context_map_arg;
  if (uVar6 < context_map_size || bVar17) {
    local_40 = (s->arena).header.context_map_table;
    uVar16 = (ulong)uVar6;
    local_54 = context_map_size;
    local_50 = br;
    do {
      uVar12 = (uint32_t)uVar16;
      if (bVar17) {
LAB_001406d4:
        uVar10 = (s->br).bit_pos_;
        bVar17 = 0x40 - uVar10 < local_58;
        if (bVar17) {
          sVar11 = (s->br).avail_in;
          if (sVar11 != 0) {
            uVar13 = (s->br).val_;
            uVar6 = 0x48 - uVar10;
            pbVar3 = (s->br).next_in;
            do {
              uVar10 = uVar10 - 8;
              sVar11 = sVar11 - 1;
              (s->br).val_ = uVar13 >> 8;
              uVar13 = (ulong)*pbVar3 << 0x38 | uVar13 >> 8;
              (s->br).val_ = uVar13;
              (s->br).bit_pos_ = uVar10;
              (s->br).avail_in = sVar11;
              (s->br).next_in = pbVar3 + 1;
              bVar17 = uVar6 < local_58;
              br = local_50;
              context_map_size = local_54;
              if (!bVar17) goto LAB_0014077c;
              uVar6 = uVar6 + 8;
              pbVar3 = pbVar3 + 1;
            } while (sVar11 != 0);
          }
        }
        else {
LAB_0014077c:
          unaff_R12 = (ulong)((uint)((s->br).val_ >> ((byte)uVar10 & 0x3f)) & kBitMask[local_58]);
          (s->br).bit_pos_ = uVar10 + local_58;
        }
        if (bVar17) {
          (s->arena).header.code = local_58;
          (s->arena).header.context_index = uVar12;
          in_R9D = BROTLI_DECODER_NEEDS_MORE_INPUT;
LAB_001407c0:
          bVar17 = false;
        }
        else {
          uVar6 = (int)unaff_R12 + (1 << ((byte)local_58 & 0x1f));
          unaff_R12 = (ulong)uVar6;
          uVar15 = uVar16;
          if (context_map_size < uVar6 + uVar12) {
            in_R9D = BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT;
            goto LAB_001407c0;
          }
          do {
            uVar16 = (ulong)((int)uVar15 + 1);
            puVar8[uVar15] = '\0';
            uVar6 = (int)unaff_R12 - 1;
            unaff_R12 = (ulong)uVar6;
            uVar15 = uVar16;
          } while (uVar6 != 0);
          unaff_R12 = 0;
          bVar17 = true;
        }
        uVar15 = uVar16;
        if (!bVar17) break;
      }
      else {
        uVar10 = (s->br).bit_pos_;
        bVar17 = uVar10 - 0x32 < 0xf;
        if (bVar17) {
          sVar11 = (s->br).avail_in;
          if (sVar11 != 0) {
            uVar13 = (s->br).val_;
            pbVar3 = (s->br).next_in;
            uVar4 = uVar10;
            do {
              uVar10 = uVar4 - 8;
              sVar11 = sVar11 - 1;
              (s->br).val_ = uVar13 >> 8;
              uVar13 = (ulong)*pbVar3 << 0x38 | uVar13 >> 8;
              (s->br).val_ = uVar13;
              (s->br).bit_pos_ = uVar10;
              (s->br).avail_in = sVar11;
              (s->br).next_in = pbVar3 + 1;
              bVar17 = uVar4 - 0x3a < 0xf;
              if (!bVar17) goto LAB_0014066f;
              pbVar3 = pbVar3 + 1;
              uVar4 = uVar10;
            } while (sVar11 != 0);
          }
        }
        else {
LAB_0014066f:
          unaff_RBP = (ulong)((uint)(br->val_ >> ((byte)uVar10 & 0x3f)) & 0x7fff);
        }
        if (bVar17) {
          local_48 = in_R9D;
          iVar5 = SafeDecodeSymbol(local_40,br,&local_58);
          br = local_50;
          context_map_size = local_54;
          in_R9D = local_48;
          if (iVar5 == 0) {
            (s->arena).header.code = 0xffff;
            (s->arena).header.context_index = uVar12;
            in_R9D = BROTLI_DECODER_NEEDS_MORE_INPUT;
            break;
          }
        }
        else {
          pHVar9 = local_40 + (unaff_RBP & 0xff);
          bVar2 = pHVar9->bits;
          if (8 < bVar2) {
            puVar1 = &(s->br).bit_pos_;
            *puVar1 = *puVar1 + 8;
            pHVar9 = pHVar9 + (((uint)(unaff_RBP >> 8) & 0xffffff & kBitMask[bVar2 - 8]) +
                              (uint)pHVar9->value);
          }
          puVar1 = &(s->br).bit_pos_;
          *puVar1 = *puVar1 + (uint)pHVar9->bits;
          local_58 = (uint32_t)pHVar9->value;
        }
        if (local_58 == 0) {
          iVar5 = 0;
        }
        else {
          iVar5 = local_58 - local_44;
          if (local_58 < local_44 || iVar5 == 0) goto LAB_001406d4;
        }
        uVar15 = (ulong)(uVar12 + 1);
        puVar8[uVar16] = (uint8_t)iVar5;
      }
      bVar17 = false;
      bVar18 = (uint)uVar15 < context_map_size;
      uVar16 = uVar15;
    } while (bVar18);
  }
  context_map_arg = local_38;
  if (bVar18) {
    return in_R9D;
  }
switchD_00140423_caseD_4:
  uVar6 = (s->br).bit_pos_;
  bVar18 = uVar6 == 0x40;
  if (bVar18) {
    sVar11 = (s->br).avail_in;
    if (sVar11 == 0) {
      bVar17 = false;
      goto LAB_001408a5;
    }
    uVar16 = (s->br).val_;
    pbVar3 = (s->br).next_in;
    (s->br).val_ = uVar16 >> 8;
    (s->br).val_ = (ulong)*pbVar3 << 0x38 | uVar16 >> 8;
    uVar6 = 0x38;
    (s->br).bit_pos_ = 0x38;
    (s->br).avail_in = sVar11 - 1;
    (s->br).next_in = pbVar3 + 1;
    bVar18 = false;
  }
  (s->br).bit_pos_ = uVar6 + 1;
  bVar17 = ((s->br).val_ >> ((ulong)uVar6 & 0x3f) & 1) == 0;
LAB_001408a5:
  BVar7 = (uint)bVar18 * 4;
  BVar14 = (uint)bVar18 + BROTLI_DECODER_SUCCESS;
  if ((bVar18 == false) && (!bVar17)) {
    InverseMoveToFrontTransform(*context_map_arg,context_map_size,s);
    BVar14 = BROTLI_DECODER_SUCCESS;
    BVar7 = BROTLI_STATE_CONTEXT_MAP_NONE;
  }
  (s->arena).header.substate_context_map = BVar7;
  return BVar14;
}

Assistant:

static BrotliDecoderErrorCode DecodeContextMap(uint32_t context_map_size,
                                               uint32_t* num_htrees,
                                               uint8_t** context_map_arg,
                                               BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;
  BrotliMetablockHeaderArena* h = &s->arena.header;

  switch ((int)h->substate_context_map) {
    case BROTLI_STATE_CONTEXT_MAP_NONE:
      result = DecodeVarLenUint8(s, br, num_htrees);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      (*num_htrees)++;
      h->context_index = 0;
      BROTLI_LOG_UINT(context_map_size);
      BROTLI_LOG_UINT(*num_htrees);
      *context_map_arg =
          (uint8_t*)BROTLI_DECODER_ALLOC(s, (size_t)context_map_size);
      if (*context_map_arg == 0) {
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP);
      }
      if (*num_htrees <= 1) {
        memset(*context_map_arg, 0, (size_t)context_map_size);
        return BROTLI_DECODER_SUCCESS;
      }
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX: {
      uint32_t bits;
      /* In next stage ReadHuffmanCode uses at least 4 bits, so it is safe
         to peek 4 bits ahead. */
      if (!BrotliSafeGetBits(br, 5, &bits)) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((bits & 1) != 0) { /* Use RLE for zeros. */
        h->max_run_length_prefix = (bits >> 1) + 1;
        BrotliDropBits(br, 5);
      } else {
        h->max_run_length_prefix = 0;
        BrotliDropBits(br, 1);
      }
      BROTLI_LOG_UINT(h->max_run_length_prefix);
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
    }
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_HUFFMAN: {
      uint32_t alphabet_size = *num_htrees + h->max_run_length_prefix;
      result = ReadHuffmanCode(alphabet_size, alphabet_size,
                               h->context_map_table, NULL, s);
      if (result != BROTLI_DECODER_SUCCESS) return result;
      h->code = 0xFFFF;
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
    }
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_DECODE: {
      uint32_t context_index = h->context_index;
      uint32_t max_run_length_prefix = h->max_run_length_prefix;
      uint8_t* context_map = *context_map_arg;
      uint32_t code = h->code;
      BROTLI_BOOL skip_preamble = (code != 0xFFFF);
      while (context_index < context_map_size || skip_preamble) {
        if (!skip_preamble) {
          if (!SafeReadSymbol(h->context_map_table, br, &code)) {
            h->code = 0xFFFF;
            h->context_index = context_index;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          BROTLI_LOG_UINT(code);

          if (code == 0) {
            context_map[context_index++] = 0;
            continue;
          }
          if (code > max_run_length_prefix) {
            context_map[context_index++] =
                (uint8_t)(code - max_run_length_prefix);
            continue;
          }
        } else {
          skip_preamble = BROTLI_FALSE;
        }
        /* RLE sub-stage. */
        {
          uint32_t reps;
          if (!BrotliSafeReadBits(br, code, &reps)) {
            h->code = code;
            h->context_index = context_index;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          reps += 1U << code;
          BROTLI_LOG_UINT(reps);
          if (context_index + reps > context_map_size) {
            return
                BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT);
          }
          do {
            context_map[context_index++] = 0;
          } while (--reps);
        }
      }
    }
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_TRANSFORM: {
      uint32_t bits;
      if (!BrotliSafeReadBits(br, 1, &bits)) {
        h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits != 0) {
        InverseMoveToFrontTransform(*context_map_arg, context_map_size, s);
      }
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_NONE;
      return BROTLI_DECODER_SUCCESS;
    }

    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}